

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_char_ptr_is_string.hpp
# Opt level: O0

void mserialize::CustomSerializer<const_char_*,_void>::serialize<binlog::detail::QueueWriter>
               (char *str,QueueWriter *ostream)

{
  string_view sVar1;
  QueueWriter *in_stack_ffffffffffffffd8;
  char *in_stack_ffffffffffffffe0;
  
  sVar1 = view(in_stack_ffffffffffffffe0);
  serialize<mserialize::string_view,binlog::detail::QueueWriter>
            ((string_view *)sVar1._ptr,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

static void serialize(const char* str, OutputStream& ostream)
  {
    mserialize::serialize(view(str), ostream);
  }